

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_parse_mem(ly_ctx *ctx,char *data,LYS_INFORMAT format,lys_module **module)

{
  ly_in *local_40;
  ly_in *in;
  lys_module **pplStack_30;
  LY_ERR ret;
  lys_module **module_local;
  char *pcStack_20;
  LYS_INFORMAT format_local;
  char *data_local;
  ly_ctx *ctx_local;
  
  local_40 = (ly_in *)0x0;
  pplStack_30 = module;
  module_local._4_4_ = format;
  pcStack_20 = data;
  data_local = (char *)ctx;
  if (data == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","data","lys_parse_mem");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (format == LYS_IN_UNKNOWN) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","format != LYS_IN_UNKNOWN",
           "lys_parse_mem");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    in._4_4_ = ly_in_new_memory(data,&local_40);
    if (in._4_4_ == LY_SUCCESS) {
      in._4_4_ = lys_parse((ly_ctx *)data_local,local_40,module_local._4_4_,(char **)0x0,pplStack_30
                          );
      ly_in_free(local_40,'\0');
      ctx_local._4_4_ = in._4_4_;
    }
    else {
      ly_log((ly_ctx *)data_local,LY_LLERR,in._4_4_,"Unable to create input handler.");
      ctx_local._4_4_ = in._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse_mem(struct ly_ctx *ctx, const char *data, LYS_INFORMAT format, struct lys_module **module)
{
    LY_ERR ret;
    struct ly_in *in = NULL;

    LY_CHECK_ARG_RET(ctx, data, format != LYS_IN_UNKNOWN, LY_EINVAL);

    LY_CHECK_ERR_RET(ret = ly_in_new_memory(data, &in), LOGERR(ctx, ret, "Unable to create input handler."), ret);

    ret = lys_parse(ctx, in, format, NULL, module);
    ly_in_free(in, 0);

    return ret;
}